

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptError * __thiscall
Js::JavascriptLibrary::CreateExternalError(JavascriptLibrary *this,ErrorTypeEnum errorTypeEnum)

{
  DynamicType **ppDVar1;
  Recycler *pRVar2;
  JavascriptError *this_00;
  TrackAllocData local_50;
  JavascriptError *local_28;
  JavascriptError *pError;
  DynamicType *baseErrorType;
  JavascriptLibrary *pJStack_10;
  ErrorTypeEnum errorTypeEnum_local;
  JavascriptLibrary *this_local;
  
  pError = (JavascriptError *)0x0;
  baseErrorType._4_4_ = errorTypeEnum;
  pJStack_10 = this;
  switch(errorTypeEnum) {
  case kjstError:
  default:
    ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                        ((WriteBarrierPtr *)&this->errorType);
    pError = (JavascriptError *)*ppDVar1;
    break;
  case kjstEvalError:
    ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                        ((WriteBarrierPtr *)&this->evalErrorType);
    pError = (JavascriptError *)*ppDVar1;
    break;
  case kjstRangeError:
    ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                        ((WriteBarrierPtr *)&this->rangeErrorType);
    pError = (JavascriptError *)*ppDVar1;
    break;
  case kjstReferenceError:
    ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                        ((WriteBarrierPtr *)&this->referenceErrorType);
    pError = (JavascriptError *)*ppDVar1;
    break;
  case kjstSyntaxError:
    ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                        ((WriteBarrierPtr *)&this->syntaxErrorType);
    pError = (JavascriptError *)*ppDVar1;
    break;
  case kjstTypeError:
    ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                        ((WriteBarrierPtr *)&this->typeErrorType);
    pError = (JavascriptError *)*ppDVar1;
    break;
  case kjstURIError:
    ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                        ((WriteBarrierPtr *)&this->uriErrorType);
    pError = (JavascriptError *)*ppDVar1;
    break;
  case kjstAggregateError:
    ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                        ((WriteBarrierPtr *)&this->aggregateErrorType);
    pError = (JavascriptError *)*ppDVar1;
    break;
  case kjstWebAssemblyCompileError:
    ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                        ((WriteBarrierPtr *)&this->webAssemblyCompileErrorType);
    pError = (JavascriptError *)*ppDVar1;
    break;
  case kjstWebAssemblyRuntimeError:
    ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                        ((WriteBarrierPtr *)&this->webAssemblyRuntimeErrorType);
    pError = (JavascriptError *)*ppDVar1;
    break;
  case kjstWebAssemblyLinkError:
    ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                        ((WriteBarrierPtr *)&this->webAssemblyLinkErrorType);
    pError = (JavascriptError *)*ppDVar1;
  }
  pRVar2 = this->recycler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&JavascriptError::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x18aa);
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_50);
  this_00 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar2,0x43c4b0);
  JavascriptError::JavascriptError(this_00,(DynamicType *)pError,1,0);
  local_28 = this_00;
  JavascriptError::SetErrorType(this_00,baseErrorType._4_4_);
  return local_28;
}

Assistant:

JavascriptError* JavascriptLibrary::CreateExternalError(ErrorTypeEnum errorTypeEnum)
    {
        DynamicType* baseErrorType = NULL;
        switch (errorTypeEnum)
        {
        case kjstError:
        default:
            baseErrorType = errorType;
            break;
        case kjstEvalError:
            baseErrorType = evalErrorType;
            break;
        case kjstRangeError:
            baseErrorType = rangeErrorType;
            break;
        case kjstReferenceError:
            baseErrorType = referenceErrorType;
            break;
        case kjstSyntaxError:
            baseErrorType = syntaxErrorType;
            break;
        case kjstTypeError:
            baseErrorType = typeErrorType;
            break;
        case kjstURIError:
            baseErrorType = uriErrorType;
            break;
        case kjstAggregateError:
            baseErrorType = aggregateErrorType;
            break;
        case kjstWebAssemblyCompileError:
            baseErrorType = webAssemblyCompileErrorType;
            break;
        case kjstWebAssemblyRuntimeError:
            baseErrorType = webAssemblyRuntimeErrorType;
            break;
        case kjstWebAssemblyLinkError:
            baseErrorType = webAssemblyLinkErrorType;
            break;
        }

        JavascriptError *pError = RecyclerNew(recycler, JavascriptError, baseErrorType, TRUE);
        JavascriptError::SetErrorType(pError, errorTypeEnum);
        return pError;
    }